

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O2

double __thiscall llvm::ECError::log(ECError *this,double __x)

{
  error_category *peVar1;
  raw_ostream *in_RSI;
  double dVar2;
  string local_38;
  
  peVar1 = (this->EC)._M_cat;
  (**(code **)(*(long *)peVar1 + 0x20))(&local_38,peVar1,(this->EC)._M_value);
  raw_ostream::operator<<(in_RSI,&local_38);
  dVar2 = (double)std::__cxx11::string::~string((string *)&local_38);
  return dVar2;
}

Assistant:

void log(raw_ostream &OS) const override { OS << EC.message(); }